

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-optimizer-common.hpp
# Opt level: O2

result * __thiscall
baryonyx::itm::
optimize_problem<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>
          (result *__return_storage_ptr__,itm *this,context *ctx,problem *pb)

{
  vector<baryonyx::solution,_std::allocator<baryonyx::solution>_> *this_00;
  int iVar1;
  int iVar2;
  uint thread_number;
  unsigned_long __res;
  uint uVar3;
  result_type_conflict rVar4;
  long lVar5;
  raw_result<baryonyx::itm::minimize_tag> *source;
  long lVar6;
  thread *t;
  pointer ptVar7;
  ulong __n;
  solution *sol;
  ulong uVar8;
  long call_number;
  long __args_4;
  int i;
  atomic_bool stop_task;
  int variables;
  long loop;
  result *local_1a8;
  int constraints_remaining;
  double duration;
  double value;
  unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_> seeds;
  double cost_constant;
  random_engine rng;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  constraints;
  default_cost_type<long_double> cost;
  vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
  functors;
  reference_wrapper<const_baryonyx::itm::default_cost_type<long_double>_> local_118;
  reference_wrapper<const_std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>_>
  local_110;
  vector<std::thread,_std::allocator<std::thread>_> pool;
  best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
  best_recorder;
  
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->duration = 0.0;
  __return_storage_ptr__->loop = 0;
  __return_storage_ptr__->variables = 0;
  __return_storage_ptr__->constraints = 0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->variable_name).
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->solutions).
  super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->strings).
  super___shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->method)._M_len = 0;
  (__return_storage_ptr__->method)._M_str = (char *)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).names.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->affected_vars).values.
  super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  __return_storage_ptr__->remaining_constraints = 0x7fffffff;
  __return_storage_ptr__->annoying_variable = 0;
  __return_storage_ptr__->status = uninitialized;
  if (*(long *)(this + 0x128) != 0) {
    std::function<void_(const_baryonyx::solver_parameters_&)>::operator()
              ((function<void_(const_baryonyx::solver_parameters_&)> *)(this + 0x118),
               (solver_parameters *)this);
  }
  make_merged_constraints(&constraints,(context *)this,(problem *)ctx);
  if ((constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       constraints.
       super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
       ._M_impl.super__Vector_impl_data._M_finish) ||
     (lVar5._0_4_ = (ctx->parameters).seed, lVar5._4_4_ = (ctx->parameters).thread,
     lVar5 == (ctx->parameters).limit)) {
    __return_storage_ptr__->status = success;
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    (__return_storage_ptr__->solutions).
    super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
    super__Vector_impl_data._M_finish[-1].value = (ctx->parameters).pushing_objective_amplifier;
    std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)
               __return_storage_ptr__,
               (__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)ctx);
    affected_variables::operator=
              (&__return_storage_ptr__->affected_vars,
               (affected_variables *)&(ctx->parameters).pushing_iteration_limit);
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::operator=(&__return_storage_ptr__->variable_name,
                (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 *)&(ctx->parameters).init_kappa_improve_increase);
    goto LAB_0019684d;
  }
  rVar4 = init_random_generator_seed((context *)this);
  rng._M_x = rVar4 % 0x7fffffff + (ulong)(rVar4 % 0x7fffffff == 0);
  variables = (int)(((ctx->parameters).limit - *(long *)&(ctx->parameters).seed) / 0xc);
  local_1a8 = __return_storage_ptr__;
  default_cost_type<long_double>::default_cost_type
            (&cost,(objective_function *)&(ctx->parameters).delta,variables);
  cost_constant = (ctx->parameters).pushing_objective_amplifier;
  thread_number = get_thread_number((context *)this);
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (ulong)thread_number;
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functors.
  super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            (&pool,__n,(allocator_type *)&best_recorder);
  best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
  ::best_solution_recorder
            (&best_recorder,&rng,thread_number,&cost,cost_constant,variables,&constraints,
             *(int *)(this + 0xc4));
  generate_seed((itm *)&seeds,&rng,thread_number);
  uVar3 = 0;
  LOCK();
  stop_task._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  while (loop = CONCAT44(loop._4_4_,uVar3), uVar3 != thread_number) {
    std::
    vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
    ::emplace_back<baryonyx::context_const&,unsigned_int&,unsigned_long&>
              ((vector<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>>
                *)&functors,(context *)this,(uint *)&loop,
               (unsigned_long *)
               ((ulong)uVar3 * 8 +
               (long)seeds._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl));
    uVar3 = (int)loop + 1;
  }
  for (uVar8 = 0; uVar8 != __n; uVar8 = uVar8 + 1) {
    value = (double)(functors.
                     super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + uVar8);
    duration = (double)&stop_task;
    _constraints_remaining = &best_recorder;
    local_110._M_data = &constraints;
    local_118._M_data = &cost;
    std::thread::
    thread<std::reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>,long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>>>,std::reference_wrapper<std::atomic<bool>>,std::reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,long_double,baryonyx::itm::minimize_tag>>,std::reference_wrapper<std::vector<baryonyx::itm::merged_constraint,std::allocator<baryonyx::itm::merged_constraint>>const>,int&,std::reference_wrapper<baryonyx::itm::default_cost_type<long_double>const>,double&,void>
              ((thread *)&loop,
               (reference_wrapper<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>
                *)&value,(reference_wrapper<std::atomic<bool>_> *)&duration,
               (reference_wrapper<baryonyx::itm::best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>_>
                *)&constraints_remaining,&local_110,&variables,&local_118,&cost_constant);
    std::thread::operator=
              (pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8,(thread *)&loop);
    std::thread::~thread((thread *)&loop);
  }
  lVar5 = std::chrono::_V2::steady_clock::now();
  do {
    loop = 1;
    std::this_thread::sleep_for<long,std::ratio<1l,1l>>
              ((duration<long,_std::ratio<1L,_1L>_> *)&loop);
    if (*(long *)(this + 0x148) != 0) {
      __args_4 = 0;
      for (lVar6 = 0; __n * 0xc0 - lVar6 != 0; lVar6 = lVar6 + 0xc0) {
        __args_4 = __args_4 +
                   *(long *)((long)&(functors.
                                     super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->m_call_number +
                            lVar6);
      }
      storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>::get_best
                (&best_recorder.m_storage,&constraints_remaining,&value,&duration,&loop);
      std::function<void_(int,_double,_long,_double,_long)>::operator()
                ((function<void_(int,_double,_long,_double,_long)> *)(this + 0x138),
                 constraints_remaining,value,loop,duration,__args_4);
    }
    lVar6 = std::chrono::_V2::steady_clock::now();
    __return_storage_ptr__ = local_1a8;
  } while ((*(double *)this <= 0.0) || ((double)(lVar6 - lVar5) / 1000000000.0 <= *(double *)this));
  LOCK();
  stop_task._M_base._M_i = (__atomic_base<bool>)true;
  UNLOCK();
  for (ptVar7 = pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_start;
      ptVar7 != pool.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish; ptVar7 = ptVar7 + 1) {
    std::thread::join();
  }
  std::__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)
             __return_storage_ptr__,
             (__shared_ptr<baryonyx::string_buffer,_(__gnu_cxx::_Lock_policy)2> *)ctx);
  affected_variables::operator=
            (&__return_storage_ptr__->affected_vars,
             (affected_variables *)&(ctx->parameters).pushing_iteration_limit);
  std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=(&__return_storage_ptr__->variable_name,
              (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&(ctx->parameters).init_kappa_improve_increase);
  __return_storage_ptr__->variables = variables;
  __return_storage_ptr__->constraints =
       (index)(((long)constraints.
                      super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)constraints.
                     super__Vector_base<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x28);
  iVar1 = *best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar2 = best_recorder.m_storage.m_data.
          super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
          ._M_impl.super__Vector_impl_data._M_start[iVar1].remaining_constraints;
  source = best_recorder.m_storage.m_data.
           super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
           ._M_impl.super__Vector_impl_data._M_start + iVar1;
  __return_storage_ptr__->status = (uint)(iVar2 != 0) * 3;
  __return_storage_ptr__->duration =
       best_recorder.m_storage.m_data.
       super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar1].duration;
  __return_storage_ptr__->loop =
       best_recorder.m_storage.m_data.
       super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar1].loop;
  __return_storage_ptr__->remaining_constraints = iVar2;
  iVar1 = *(int *)(this + 0xe8);
  if (iVar1 == 0) {
    std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
              (&__return_storage_ptr__->solutions,1);
    sol = (__return_storage_ptr__->solutions).
          super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>._M_impl.
          super__Vector_impl_data._M_start;
LAB_001967dd:
    convert<baryonyx::itm::minimize_tag>(source,sol,variables);
  }
  else {
    if (iVar1 == 1) {
      this_00 = &__return_storage_ptr__->solutions;
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize(this_00,2);
      convert<baryonyx::itm::minimize_tag>
                (source,(this_00->
                        super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>)
                        ._M_impl.super__Vector_impl_data._M_start,variables);
      source = storage<baryonyx::itm::default_cost_type<long_double>,_baryonyx::itm::minimize_tag>::
               get_worst(&best_recorder.m_storage);
      sol = (this_00->super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>).
            _M_impl.super__Vector_impl_data._M_start + 1;
      goto LAB_001967dd;
    }
    if (iVar1 == 2) {
      std::vector<baryonyx::solution,_std::allocator<baryonyx::solution>_>::resize
                (&__return_storage_ptr__->solutions,5);
      lVar5 = 0;
      for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
        convert<baryonyx::itm::minimize_tag>
                  (best_recorder.m_storage.m_data.
                   super__Vector_base<baryonyx::raw_result<baryonyx::itm::minimize_tag>,_std::allocator<baryonyx::raw_result<baryonyx::itm::minimize_tag>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   best_recorder.m_storage.m_indices.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start[lVar6],
                   (solution *)
                   ((long)&(((__return_storage_ptr__->solutions).
                             super__Vector_base<baryonyx::solution,_std::allocator<baryonyx::solution>_>
                             ._M_impl.super__Vector_impl_data._M_start)->variables).
                           super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl +
                   lVar5),variables);
        lVar5 = lVar5 + 0x20;
      }
    }
  }
  best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
  ::show_population(&best_recorder,(context *)this);
  if (*(long *)(this + 0x168) != 0) {
    std::function<void_(const_baryonyx::result_&)>::operator()
              ((function<void_(const_baryonyx::result_&)> *)(this + 0x158),__return_storage_ptr__);
  }
  std::unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>::~unique_ptr(&seeds);
  best_solution_recorder<baryonyx::itm::default_cost_type<long_double>,_long_double,_baryonyx::itm::minimize_tag>
  ::~best_solution_recorder(&best_recorder);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&pool);
  std::
  _Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
  ::~_Vector_base(&functors.
                   super__Vector_base<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_std::allocator<baryonyx::itm::optimize_functor<baryonyx::itm::solver_random_inequalities_101coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>,_long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>_>_>_>
                 );
  std::unique_ptr<long_double[],_std::default_delete<long_double[]>_>::~unique_ptr
            (&cost.linear_elements);
LAB_0019684d:
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  ~vector(&constraints);
  return __return_storage_ptr__;
}

Assistant:

inline result
optimize_problem(const context& ctx, const problem& pb)
{
    result r;

    if (ctx.start)
        ctx.start(ctx.parameters);

    auto constraints{ make_merged_constraints(ctx, pb) };
    if (constraints.empty() || pb.vars.values.empty()) {
        r.status = result_status::success;
        r.solutions.resize(1);
        r.solutions.back().value = pb.objective.value;
        r.strings = pb.strings;
        r.affected_vars = pb.affected_vars;
        r.variable_name = pb.vars.names;
        return r;
    }

    random_engine rng(init_random_generator_seed(ctx));

    auto variables = length(pb.vars.values);
    auto cost = Cost(pb.objective, variables);
    auto cost_constant = pb.objective.value;

    const auto thread = get_thread_number(ctx);

    std::vector<optimize_functor<Solver, Float, Mode, Cost>> functors;
    std::vector<std::thread> pool(thread);

    best_solution_recorder<Cost, Float, Mode> best_recorder(
      rng,
      thread,
      cost,
      cost_constant,
      variables,
      constraints,
      ctx.parameters.init_population_size);

    auto seeds = generate_seed(rng, thread);

    std::atomic_bool stop_task;
    stop_task.store(false);

    for (unsigned i = 0u; i != thread; ++i)
        functors.emplace_back(ctx, i, seeds[i]);

    for (unsigned i = 0u; i != thread; ++i)
        pool[i] = std::thread(std::ref(functors[i]),
                              std::ref(stop_task),
                              std::ref(best_recorder),
                              std::cref(constraints),
                              variables,
                              std::cref(cost),
                              cost_constant);

    const auto start = std::chrono::steady_clock::now();
    auto end = start;

    do {
        std::this_thread::sleep_for(std::chrono::seconds{ 1L });

        if (ctx.update) {
            auto call_number = 0L;
            for (auto i = 0u; i != thread; ++i)
                call_number += functors[i].m_call_number;

            int constraints_remaining;
            long int loop;
            double value;
            double duration;

            best_recorder.get_best(
              constraints_remaining, value, duration, loop);

            ctx.update(
              constraints_remaining, value, loop, duration, call_number);
        }

        end = std::chrono::steady_clock::now();
    } while (!is_time_limit(ctx.parameters.time_limit, start, end));

    stop_task.store(true);

    for (auto& t : pool)
        t.join();

    r.strings = pb.strings;
    r.affected_vars = pb.affected_vars;
    r.variable_name = pb.vars.names;
    r.variables = variables;
    r.constraints = length(constraints);

    const auto& first = best_recorder.get_best(0);

    if (!first.is_solution())
        r.status = result_status::time_limit_reached;
    else
        r.status = result_status::success;

    r.duration = first.duration;
    r.loop = first.loop;
    r.remaining_constraints = first.remaining_constraints;

    switch (ctx.parameters.storage) {
    case solver_parameters::storage_type::one: {
        r.solutions.resize(1);
        convert(first, r.solutions[0], variables);
    } break;

    case solver_parameters::storage_type::bound: {
        r.solutions.resize(2);

        convert(first, r.solutions[0], variables);
        convert(best_recorder.get_worst(), r.solutions[1], variables);
    } break;

    case solver_parameters::storage_type::five: {
        r.solutions.resize(5);

        for (int i = 0; i != 5; ++i)
            convert(best_recorder.get_best(i), r.solutions[i], variables);
    } break;
    }

    best_recorder.show_population(ctx);

    if (ctx.finish)
        ctx.finish(r);

    return r;
}